

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O0

int luaopen_math(lua_State *L)

{
  undefined8 *puVar1;
  PRNGState *rs;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)lua_newuserdata(L,0x20);
  *puVar1 = 0xa0d277570a345b8c;
  puVar1[1] = 0x764a296c5d4aa64f;
  puVar1[2] = 0x51220704070adeaa;
  puVar1[3] = 0x2a2717b5a7b7b927;
  lj_lib_register(L,"math",lj_lib_init_math,lj_lib_cf_math);
  return 1;
}

Assistant:

LUALIB_API int luaopen_math(lua_State *L)
{
  PRNGState *rs = (PRNGState *)lua_newuserdata(L, sizeof(PRNGState));
  lj_prng_seed_fixed(rs);
  LJ_LIB_REG(L, LUA_MATHLIBNAME, math);
  return 1;
}